

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BufferDetail.hh
# Opt level: O0

void __thiscall avro::detail::Chunk::Chunk(Chunk *this,size_type size)

{
  char *pcVar1;
  ulong in_RSI;
  shared_array<char> *in_RDI;
  char *in_stack_ffffffffffffffb8;
  
  boost::shared_ptr<avro::detail::CallOnDestroy>::shared_ptr
            ((shared_ptr<avro::detail::CallOnDestroy> *)0x2ab455);
  operator_new__(in_RSI);
  boost::shared_array<char>::shared_array<char>(in_RDI,in_stack_ffffffffffffffb8);
  pcVar1 = boost::shared_array<char>::get(in_RDI + 1);
  in_RDI[2].px = pcVar1;
  in_RDI[2].pn.pi_ = (sp_counted_base *)in_RDI[2].px;
  in_RDI[3].px = in_RDI[2].px + in_RSI;
  return;
}

Assistant:

Chunk(size_type size) :
        underlyingBlock_(new data_type[size]), 
        readPos_(underlyingBlock_.get()),
        writePos_(readPos_),
        endPos_(readPos_ + size)
    { }